

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushAllowKeyboardFocus(bool allow_keyboard_focus)

{
  ImGuiWindow *pIVar1;
  bool in_DIL;
  value_type_conflict local_1;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  (pIVar1->DC).AllowKeyboardFocus = in_DIL;
  ImVector<bool>::push_back(&(pIVar1->DC).AllowKeyboardFocusStack,&local_1);
  return;
}

Assistant:

void ImGui::PushAllowKeyboardFocus(bool allow_keyboard_focus)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.AllowKeyboardFocus = allow_keyboard_focus;
    window->DC.AllowKeyboardFocusStack.push_back(allow_keyboard_focus);
}